

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  ActivationLinear *__val;
  uint uVar4;
  bool bVar5;
  undefined1 *puVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  size_type *psVar10;
  ActivationLinear *pAVar11;
  long *plVar12;
  ulong *puVar13;
  ulong uVar14;
  Result *_result;
  uint uVar15;
  uint uVar16;
  string err;
  string __str;
  string local_150;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Argsort","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (layer->_oneof_case_[0] == 0x5b5) {
    puVar6 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar6 = Specification::_ArgSortLayerParams_default_instance_;
  }
  __val = (((ActivationParams *)puVar6)->NonlinearityType_).linear_;
  if ((long)__val < 0) {
    std::operator+(&local_f0,
                   "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_150.field_2._M_allocated_capacity = *psVar10;
      local_150.field_2._8_8_ = plVar7[3];
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar10;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p == &local_150.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_003547e2;
  }
  if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
     (uVar2 = *(uint *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                       0x24), (long)__val < (long)(int)uVar2)) {
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  uVar15 = 1;
  if ((ActivationLinear *)0x9 < __val) {
    pAVar11 = __val;
    uVar16 = 4;
    do {
      uVar15 = uVar16;
      if (pAVar11 < (ActivationLinear *)0x64) {
        uVar15 = uVar15 - 2;
        goto LAB_0035480b;
      }
      if (pAVar11 < (ActivationLinear *)0x3e8) {
        uVar15 = uVar15 - 1;
        goto LAB_0035480b;
      }
      if (pAVar11 < (ActivationLinear *)0x2710) goto LAB_0035480b;
      bVar5 = (ActivationLinear *)0x1869f < pAVar11;
      pAVar11 = (ActivationLinear *)((ulong)pAVar11 / 10000);
      uVar16 = uVar15 + 4;
    } while (bVar5);
    uVar15 = uVar15 + 1;
  }
LAB_0035480b:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)uVar15);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90[0],uVar15,(unsigned_long)__val);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x3c1587);
  local_b0 = &local_a0;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_a0 = *plVar12;
    lStack_98 = plVar7[3];
  }
  else {
    local_a0 = *plVar12;
    local_b0 = (long *)*plVar7;
  }
  local_a8 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_130 = &local_120;
  puVar13 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar13) {
    local_120 = *puVar13;
    lStack_118 = plVar7[3];
  }
  else {
    local_120 = *puVar13;
    local_130 = (ulong *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar15 = -uVar2;
  if (0 < (int)uVar2) {
    uVar15 = uVar2;
  }
  uVar16 = 1;
  if (9 < uVar15) {
    uVar14 = (ulong)uVar15;
    uVar4 = 4;
    do {
      uVar16 = uVar4;
      uVar9 = (uint)uVar14;
      if (uVar9 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_0035495b;
      }
      if (uVar9 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_0035495b;
      }
      if (uVar9 < 10000) goto LAB_0035495b;
      uVar14 = uVar14 / 10000;
      uVar4 = uVar16 + 4;
    } while (99999 < uVar9);
    uVar16 = uVar16 + 1;
  }
LAB_0035495b:
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar16 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_d0),uVar16,uVar15);
  uVar14 = 0xf;
  if (local_130 != &local_120) {
    uVar14 = local_120;
  }
  if (uVar14 < (ulong)(local_c8 + local_128)) {
    uVar14 = 0xf;
    if (local_d0 != local_c0) {
      uVar14 = local_c0[0];
    }
    if (uVar14 < (ulong)(local_c8 + local_128)) goto LAB_003549e4;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_003549e4:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  local_110 = &local_100;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_100 = *plVar7;
    uStack_f8 = puVar8[3];
  }
  else {
    local_100 = *plVar7;
    local_110 = (long *)*puVar8;
  }
  local_108 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_60 = *plVar12;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar12;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,
                              *(ulong *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
                                        ));
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_f0.field_2._M_allocated_capacity = *psVar10;
    local_f0.field_2._8_8_ = plVar7[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar10;
    local_f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_150.field_2._M_allocated_capacity = *psVar10;
    local_150.field_2._8_8_ = plVar7[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar10;
    local_150._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_150._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p == &local_150.field_2) {
    return __return_storage_ptr__;
  }
LAB_003547e2:
  operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Argsort", blobNameToRank));

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}